

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,FILE *fp)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  size_t sVar3;
  size_t read;
  size_t size;
  long filelength;
  FILE *fp_local;
  XMLDocument *this_local;
  
  Clear(this);
  fseek((FILE *)fp,0,0);
  iVar1 = fgetc((FILE *)fp);
  if ((iVar1 == -1) && (iVar1 = ferror((FILE *)fp), iVar1 != 0)) {
    SetError(this,XML_ERROR_FILE_READ_ERROR,(char *)0x0,(char *)0x0);
    return this->_errorID;
  }
  fseek((FILE *)fp,0,2);
  __n = ftell((FILE *)fp);
  fseek((FILE *)fp,0,0);
  if (__n == 0xffffffffffffffff) {
    SetError(this,XML_ERROR_FILE_READ_ERROR,(char *)0x0,(char *)0x0);
    this_local._4_4_ = this->_errorID;
  }
  else if (__n == 0xffffffffffffffff) {
    SetError(this,XML_ERROR_FILE_READ_ERROR,(char *)0x0,(char *)0x0);
    this_local._4_4_ = this->_errorID;
  }
  else if (__n == 0) {
    SetError(this,XML_ERROR_EMPTY_DOCUMENT,(char *)0x0,(char *)0x0);
    this_local._4_4_ = this->_errorID;
  }
  else {
    pcVar2 = (char *)operator_new__(__n + 1);
    this->_charBuffer = pcVar2;
    sVar3 = fread(this->_charBuffer,1,__n,(FILE *)fp);
    if (sVar3 == __n) {
      this->_charBuffer[__n] = '\0';
      Parse(this);
      this_local._4_4_ = this->_errorID;
    }
    else {
      SetError(this,XML_ERROR_FILE_READ_ERROR,(char *)0x0,(char *)0x0);
      this_local._4_4_ = this->_errorID;
    }
  }
  return this_local._4_4_;
}

Assistant:

XMLError XMLDocument::LoadFile( FILE* fp )
{
    Clear();

    fseek( fp, 0, SEEK_SET );
    if ( fgetc( fp ) == EOF && ferror( fp ) != 0 ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    fseek( fp, 0, SEEK_END );
    const long filelength = ftell( fp );
    fseek( fp, 0, SEEK_SET );
    if ( filelength == -1L ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    if ( (unsigned long)filelength >= (size_t)-1 ) {
        // Cannot handle files which won't fit in buffer together with null terminator
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    if ( filelength == 0 ) {
        SetError( XML_ERROR_EMPTY_DOCUMENT, 0, 0 );
        return _errorID;
    }

    const size_t size = filelength;
    _charBuffer = new char[size+1];
    size_t read = fread( _charBuffer, 1, size, fp );
    if ( read != size ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    _charBuffer[size] = 0;

    Parse();
    return _errorID;
}